

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O0

NFRule * __thiscall icu_63::NFRuleSet::findFractionRuleSetRule(NFRuleSet *this,double number)

{
  uint32_t uVar1;
  NFRule *pNVar2;
  int64_t iVar3;
  int64_t iVar4;
  double d;
  double n;
  uint32_t i_1;
  int32_t winner;
  int64_t difference;
  int64_t tempDifference;
  uint32_t i;
  int64_t numerator;
  int64_t leastCommonMultiple;
  double number_local;
  NFRuleSet *this_local;
  
  pNVar2 = NFRuleList::operator[](&this->rules,0);
  numerator = NFRule::getBaseValue(pNVar2);
  for (tempDifference._4_4_ = 1; uVar1 = NFRuleList::size(&this->rules),
      tempDifference._4_4_ < uVar1; tempDifference._4_4_ = tempDifference._4_4_ + 1) {
    pNVar2 = NFRuleList::operator[](&this->rules,tempDifference._4_4_);
    iVar3 = NFRule::getBaseValue(pNVar2);
    numerator = util_lcm(numerator,iVar3);
  }
  iVar3 = util64_fromDouble(number * (double)numerator + 0.5);
  d = uprv_maxMantissa_63();
  _i_1 = util64_fromDouble(d);
  n._4_4_ = 0;
  for (n._0_4_ = 0; uVar1 = NFRuleList::size(&this->rules), n._0_4_ < uVar1; n._0_4_ = n._0_4_ + 1)
  {
    pNVar2 = NFRuleList::operator[](&this->rules,n._0_4_);
    iVar4 = NFRule::getBaseValue(pNVar2);
    difference = (iVar3 * iVar4) % numerator;
    if (numerator - difference < difference) {
      difference = numerator - difference;
    }
    if (difference < _i_1) {
      _i_1 = difference;
      n._4_4_ = n._0_4_;
      if (difference == 0) break;
    }
  }
  uVar1 = NFRuleList::size(&this->rules);
  if (n._4_4_ + 1 < uVar1) {
    pNVar2 = NFRuleList::operator[](&this->rules,n._4_4_ + 1);
    iVar3 = NFRule::getBaseValue(pNVar2);
    pNVar2 = NFRuleList::operator[](&this->rules,n._4_4_);
    iVar4 = NFRule::getBaseValue(pNVar2);
    if (iVar3 == iVar4) {
      pNVar2 = NFRuleList::operator[](&this->rules,n._4_4_);
      iVar3 = NFRule::getBaseValue(pNVar2);
      if (((double)iVar3 * number < 0.5) || (2.0 <= (double)iVar3 * number)) {
        n._4_4_ = n._4_4_ + 1;
      }
    }
  }
  pNVar2 = NFRuleList::operator[](&this->rules,n._4_4_);
  return pNVar2;
}

Assistant:

const NFRule*
NFRuleSet::findFractionRuleSetRule(double number) const
{
    // the obvious way to do this (multiply the value being formatted
    // by each rule's base value until you get an integral result)
    // doesn't work because of rounding error.  This method is more
    // accurate

    // find the least common multiple of the rules' base values
    // and multiply this by the number being formatted.  This is
    // all the precision we need, and we can do all of the rest
    // of the math using integer arithmetic
    int64_t leastCommonMultiple = rules[0]->getBaseValue();
    int64_t numerator;
    {
        for (uint32_t i = 1; i < rules.size(); ++i) {
            leastCommonMultiple = util_lcm(leastCommonMultiple, rules[i]->getBaseValue());
        }
        numerator = util64_fromDouble(number * (double)leastCommonMultiple + 0.5);
    }
    // for each rule, do the following...
    int64_t tempDifference;
    int64_t difference = util64_fromDouble(uprv_maxMantissa());
    int32_t winner = 0;
    for (uint32_t i = 0; i < rules.size(); ++i) {
        // "numerator" is the numerator of the fraction if the
        // denominator is the LCD.  The numerator if the rule's
        // base value is the denominator is "numerator" times the
        // base value divided bythe LCD.  Here we check to see if
        // that's an integer, and if not, how close it is to being
        // an integer.
        tempDifference = numerator * rules[i]->getBaseValue() % leastCommonMultiple;


        // normalize the result of the above calculation: we want
        // the numerator's distance from the CLOSEST multiple
        // of the LCD
        if (leastCommonMultiple - tempDifference < tempDifference) {
            tempDifference = leastCommonMultiple - tempDifference;
        }

        // if this is as close as we've come, keep track of how close
        // that is, and the line number of the rule that did it.  If
        // we've scored a direct hit, we don't have to look at any more
        // rules
        if (tempDifference < difference) {
            difference = tempDifference;
            winner = i;
            if (difference == 0) {
                break;
            }
        }
    }

    // if we have two successive rules that both have the winning base
    // value, then the first one (the one we found above) is used if
    // the numerator of the fraction is 1 and the second one is used if
    // the numerator of the fraction is anything else (this lets us
    // do things like "one third"/"two thirds" without haveing to define
    // a whole bunch of extra rule sets)
    if ((unsigned)(winner + 1) < rules.size() &&
        rules[winner + 1]->getBaseValue() == rules[winner]->getBaseValue()) {
        double n = ((double)rules[winner]->getBaseValue()) * number;
        if (n < 0.5 || n >= 2) {
            ++winner;
        }
    }

    // finally, return the winning rule
    return rules[winner];
}